

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * fts3QuoteId(char *zInput)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  char *local_30;
  char *z;
  int i;
  char *zRet;
  sqlite3_int64 nRet;
  char *zInput_local;
  
  sVar2 = strlen(zInput);
  pcVar3 = (char *)sqlite3_malloc64((long)((int)sVar2 * 2 + 3));
  if (pcVar3 != (char *)0x0) {
    *pcVar3 = '\"';
    pcVar1 = pcVar3;
    for (z._4_4_ = 0; local_30 = pcVar1 + 1, zInput[z._4_4_] != '\0'; z._4_4_ = z._4_4_ + 1) {
      if (zInput[z._4_4_] == '\"') {
        *local_30 = '\"';
        local_30 = pcVar1 + 2;
      }
      *local_30 = zInput[z._4_4_];
      pcVar1 = local_30;
    }
    *local_30 = '\"';
    pcVar1[2] = '\0';
  }
  return pcVar3;
}

Assistant:

static char *fts3QuoteId(char const *zInput){
  sqlite3_int64 nRet;
  char *zRet;
  nRet = 2 + (int)strlen(zInput)*2 + 1;
  zRet = sqlite3_malloc64(nRet);
  if( zRet ){
    int i;
    char *z = zRet;
    *(z++) = '"';
    for(i=0; zInput[i]; i++){
      if( zInput[i]=='"' ) *(z++) = '"';
      *(z++) = zInput[i];
    }
    *(z++) = '"';
    *(z++) = '\0';
  }
  return zRet;
}